

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O2

void resampleto_dsp(t_resample *x,t_sample *out,int insize,int outsize,int method)

{
  int iVar1;
  t_sample *in;
  
  iVar1 = x->s_n;
  if (insize == outsize) {
    if (iVar1 != 0) {
      freebytes(x->s_vec,(long)iVar1 << 2);
    }
    x->s_n = 0;
    x->s_vec = out;
    return;
  }
  in = x->s_vec;
  if (iVar1 != insize) {
    freebytes(in,(long)iVar1 << 2);
    in = (t_sample *)getbytes((long)insize << 2);
    x->s_vec = in;
    x->s_n = insize;
  }
  resample_dsp(x,in,insize,out,outsize,method);
  return;
}

Assistant:

void resampleto_dsp(t_resample *x,
                         t_sample *out,
                         int insize, int outsize, int method)
{
  if (insize==outsize) {
    if (x->s_n)t_freebytes(x->s_vec, x->s_n * sizeof(*x->s_vec));
    x->s_n = 0;
    x->s_vec = out;
    return;
  }

  if (x->s_n != insize) {
    t_sample *buf=x->s_vec;
    t_freebytes(buf, x->s_n * sizeof(*buf));
    buf = (t_sample *)t_getbytes(insize * sizeof(*buf));
    x->s_vec = buf;
    x->s_n   = insize;
  }

  resample_dsp(x, x->s_vec, x->s_n, out, outsize, method);

  return;
}